

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void config_set_value(ALLEGRO_CONFIG *config,ALLEGRO_USTR *section,ALLEGRO_USTR *key,
                     ALLEGRO_USTR *value)

{
  ALLEGRO_CONFIG_SECTION *key_00;
  ALLEGRO_CONFIG_ENTRY *pAVar1;
  ALLEGRO_USTR *pAVar2;
  Aatree *pAVar3;
  Aatree *in_RCX;
  size_t in_RDX;
  ALLEGRO_CONFIG_ENTRY *entry;
  ALLEGRO_CONFIG_SECTION *s;
  ALLEGRO_USTR *in_stack_ffffffffffffffc8;
  ALLEGRO_CONFIG_SECTION *in_stack_ffffffffffffffd0;
  
  key_00 = find_section((ALLEGRO_CONFIG *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (key_00 != (ALLEGRO_CONFIG_SECTION *)0x0) {
    pAVar1 = find_entry(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (pAVar1 != (ALLEGRO_CONFIG_ENTRY *)0x0) {
      al_ustr_assign((ALLEGRO_USTR *)pAVar1,in_stack_ffffffffffffffc8);
      al_ustr_trim_ws((ALLEGRO_USTR *)0x14b501);
      return;
    }
    in_stack_ffffffffffffffd0 = (ALLEGRO_CONFIG_SECTION *)0x0;
  }
  pAVar1 = (ALLEGRO_CONFIG_ENTRY *)
           al_calloc_with_context
                     (in_RDX,(size_t)in_RCX,(int)((ulong)key_00 >> 0x20),
                      (char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  pAVar1->is_comment = false;
  pAVar2 = al_ustr_dup((ALLEGRO_USTR *)0x14b541);
  pAVar1->key = pAVar2;
  pAVar2 = al_ustr_dup((ALLEGRO_USTR *)0x14b557);
  pAVar1->value = pAVar2;
  al_ustr_trim_ws((ALLEGRO_USTR *)0x14b571);
  if (key_00 == (ALLEGRO_CONFIG_SECTION *)0x0) {
    key_00 = config_add_section((ALLEGRO_CONFIG *)0x0,(ALLEGRO_USTR *)pAVar1);
  }
  if (key_00->head == (ALLEGRO_CONFIG_ENTRY *)0x0) {
    key_00->head = pAVar1;
    key_00->last = pAVar1;
  }
  else {
    key_00->last->next = pAVar1;
    pAVar1->prev = key_00->last;
    key_00->last = pAVar1;
  }
  pAVar3 = _al_aa_insert(in_RCX,key_00,pAVar1,(_al_cmp_t)in_stack_ffffffffffffffc8);
  key_00->tree = (_AL_AATREE *)pAVar3;
  return;
}

Assistant:

static void config_set_value(ALLEGRO_CONFIG *config,
   const ALLEGRO_USTR *section, const ALLEGRO_USTR *key,
   const ALLEGRO_USTR *value)
{
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *entry;

   s = find_section(config, section);
   if (s) {
      entry = find_entry(s, key);
      if (entry) {
         al_ustr_assign(entry->value, value);
         al_ustr_trim_ws(entry->value);
         return;
      }
   }

   entry = al_calloc(1, sizeof(ALLEGRO_CONFIG_ENTRY));
   entry->is_comment = false;
   entry->key = al_ustr_dup(key);
   entry->value = al_ustr_dup(value);
   al_ustr_trim_ws(entry->value);

   if (!s) {
      s = config_add_section(config, section);
   }

   if (s->head == NULL) {
      s->head = entry;
      s->last = entry;
   }
   else {
      ASSERT(s->last->next == NULL);
      s->last->next = entry;
      entry->prev = s->last;
      s->last = entry;
   }

   s->tree = _al_aa_insert(s->tree, entry->key, entry, cmp_ustr);
}